

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPSocket.cpp
# Opt level: O3

void hwnet::TCPSocket::onTimer(Ptr *t,Ptr *s)

{
  Poller *this;
  bool bVar1;
  int iVar2;
  long lVar3;
  element_type *peVar4;
  undefined1 local_78 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_70;
  _Tuple_impl<0UL,_std::shared_ptr<hwnet::TCPSocket>,_std::shared_ptr<hwnet::util::Timer>_> local_68
  ;
  _Any_data local_48;
  code *local_38;
  
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)
                             &((s->super___shared_ptr<hwnet::TCPSocket,_(__gnu_cxx::_Lock_policy)2>)
                              ._M_ptr)->mtx);
  if (iVar2 != 0) {
    std::__throw_system_error(iVar2);
  }
  peVar4 = (s->super___shared_ptr<hwnet::TCPSocket,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  if (((peVar4->sendTimeout == 0) ||
      ((peVar4->sendTimeoutCallback_).super__Function_base._M_manager == (_Manager_type)0x0)) ||
     (peVar4->ptrSendlist->head == (sendContext *)0x0)) {
LAB_001167d6:
    bVar1 = false;
  }
  else {
    lVar3 = std::chrono::_V2::steady_clock::now();
    peVar4 = (s->super___shared_ptr<hwnet::TCPSocket,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    if ((ulong)(lVar3 - (peVar4->lastSendTime).__d.__r) <= peVar4->sendTimeout * 1000000)
    goto LAB_001167d6;
    local_78 = (undefined1  [8])checkTimeout;
    local_70._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    std::_Tuple_impl<0ul,std::shared_ptr<hwnet::TCPSocket>,std::shared_ptr<hwnet::util::Timer>>::
    _Tuple_impl<std::shared_ptr<hwnet::TCPSocket>&,std::shared_ptr<hwnet::util::Timer>const&,void>
              (&local_68,s,t);
    std::function<void()>::
    function<std::_Bind<void(hwnet::TCPSocket::*(std::shared_ptr<hwnet::TCPSocket>,std::shared_ptr<hwnet::util::Timer>))(std::shared_ptr<hwnet::util::Timer>)>,void>
              ((function<void()> *)local_48._M_pod_data,
               (_Bind<void_(hwnet::TCPSocket::*(std::shared_ptr<hwnet::TCPSocket>,_std::shared_ptr<hwnet::util::Timer>))(std::shared_ptr<hwnet::util::Timer>)>
                *)local_78);
    std::__cxx11::list<std::function<void()>,std::allocator<std::function<void()>>>::
    _M_insert<std::function<void()>>
              ((list<std::function<void()>,std::allocator<std::function<void()>>> *)
               &peVar4->closures,(iterator)&peVar4->closures,(function<void_()> *)&local_48);
    if (local_38 != (code *)0x0) {
      (*local_38)(&local_48,&local_48,__destroy_functor);
    }
    if (local_68.super__Head_base<0UL,_std::shared_ptr<hwnet::TCPSocket>,_false>._M_head_impl.
        super___shared_ptr<hwnet::TCPSocket,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_68.super__Head_base<0UL,_std::shared_ptr<hwnet::TCPSocket>,_false>.
                 _M_head_impl.super___shared_ptr<hwnet::TCPSocket,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if (local_68.super__Tuple_impl<1UL,_std::shared_ptr<hwnet::util::Timer>_>.
        super__Head_base<1UL,_std::shared_ptr<hwnet::util::Timer>,_false>._M_head_impl.
        super___shared_ptr<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_68.super__Tuple_impl<1UL,_std::shared_ptr<hwnet::util::Timer>_>.
                 super__Head_base<1UL,_std::shared_ptr<hwnet::util::Timer>,_false>._M_head_impl.
                 super___shared_ptr<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    peVar4 = (s->super___shared_ptr<hwnet::TCPSocket,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    if (peVar4->doing != false) goto LAB_001167d6;
    peVar4->doing = true;
    bVar1 = true;
  }
  if (((peVar4->recvTimeout != 0) &&
      ((peVar4->recvTimeoutCallback_).super__Function_base._M_manager != (_Manager_type)0x0)) &&
     ((peVar4->recvList).
      super__List_base<std::shared_ptr<hwnet::Buffer>,_std::allocator<std::shared_ptr<hwnet::Buffer>_>_>
      ._M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)&peVar4->recvList)) {
    lVar3 = std::chrono::_V2::steady_clock::now();
    peVar4 = (s->super___shared_ptr<hwnet::TCPSocket,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    if (peVar4->recvTimeout * 1000000 < (ulong)(lVar3 - (peVar4->lastRecvTime).__d.__r)) {
      local_78 = (undefined1  [8])checkTimeout;
      local_70._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      std::_Tuple_impl<0ul,std::shared_ptr<hwnet::TCPSocket>,std::shared_ptr<hwnet::util::Timer>>::
      _Tuple_impl<std::shared_ptr<hwnet::TCPSocket>&,std::shared_ptr<hwnet::util::Timer>const&,void>
                (&local_68,s,t);
      std::function<void()>::
      function<std::_Bind<void(hwnet::TCPSocket::*(std::shared_ptr<hwnet::TCPSocket>,std::shared_ptr<hwnet::util::Timer>))(std::shared_ptr<hwnet::util::Timer>)>,void>
                ((function<void()> *)local_48._M_pod_data,
                 (_Bind<void_(hwnet::TCPSocket::*(std::shared_ptr<hwnet::TCPSocket>,_std::shared_ptr<hwnet::util::Timer>))(std::shared_ptr<hwnet::util::Timer>)>
                  *)local_78);
      std::__cxx11::list<std::function<void()>,std::allocator<std::function<void()>>>::
      _M_insert<std::function<void()>>
                ((list<std::function<void()>,std::allocator<std::function<void()>>> *)
                 &peVar4->closures,(iterator)&peVar4->closures,(function<void_()> *)&local_48);
      if (local_38 != (code *)0x0) {
        (*local_38)(&local_48,&local_48,__destroy_functor);
      }
      if (local_68.super__Head_base<0UL,_std::shared_ptr<hwnet::TCPSocket>,_false>._M_head_impl.
          super___shared_ptr<hwnet::TCPSocket,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_68.super__Head_base<0UL,_std::shared_ptr<hwnet::TCPSocket>,_false>.
                   _M_head_impl.super___shared_ptr<hwnet::TCPSocket,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      if (local_68.super__Tuple_impl<1UL,_std::shared_ptr<hwnet::util::Timer>_>.
          super__Head_base<1UL,_std::shared_ptr<hwnet::util::Timer>,_false>._M_head_impl.
          super___shared_ptr<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_68.super__Tuple_impl<1UL,_std::shared_ptr<hwnet::util::Timer>_>.
                   super__Head_base<1UL,_std::shared_ptr<hwnet::util::Timer>,_false>._M_head_impl.
                   super___shared_ptr<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi);
      }
      peVar4 = (s->super___shared_ptr<hwnet::TCPSocket,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      if (peVar4->doing == false) {
        peVar4->doing = true;
        pthread_mutex_unlock((pthread_mutex_t *)&peVar4->mtx);
        goto LAB_001168c9;
      }
    }
  }
  pthread_mutex_unlock((pthread_mutex_t *)&peVar4->mtx);
  if (!bVar1) {
    return;
  }
LAB_001168c9:
  local_78 = (undefined1  [8])
             (s->super___shared_ptr<hwnet::TCPSocket,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  this = ((element_type *)local_78)->poller_;
  local_70._M_pi =
       (s->super___shared_ptr<hwnet::TCPSocket,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  peVar4 = (element_type *)local_78;
  if (local_70._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_70._M_pi)->_M_use_count = (local_70._M_pi)->_M_use_count + 1;
      UNLOCK();
      peVar4 = (s->super___shared_ptr<hwnet::TCPSocket,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    }
    else {
      (local_70._M_pi)->_M_use_count = (local_70._M_pi)->_M_use_count + 1;
    }
  }
  Poller::PostTask(this,(Ptr *)local_78,peVar4->pool_);
  if (local_70._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_70._M_pi);
  }
  return;
}

Assistant:

void TCPSocket::onTimer(const hwnet::util::Timer::Ptr &t,TCPSocket::Ptr s) {
	auto post = false;

	s->mtx.lock();
	
	if(s->sendTimeout > 0 && 
	   s->sendTimeoutCallback_ && !s->ptrSendlist->empty() &&
	   (util::milliseconds)((std::chrono::steady_clock::now() - s->lastSendTime).count()) > s->sendTimeout*1000000) {
		s->closures.push_back(std::bind(&TCPSocket::checkTimeout, s,t));
		if(!s->doing){
			s->doing = true;
			post = true;
		}
	}

	if(s->recvTimeout > 0 && 
	   s->recvTimeoutCallback_ && !s->recvListEmpty() &&
	   (util::milliseconds)((std::chrono::steady_clock::now() - s->lastRecvTime).count()) > s->recvTimeout*1000000) {
		s->closures.push_back(std::bind(&TCPSocket::checkTimeout, s,t));
		if(!s->doing){
			s->doing = true;
			post = true;
		}
	}


	s->mtx.unlock();

	if(post) {
		s->poller_->PostTask(s,s->pool_);
	}

}